

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  _Bool _Var1;
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t uVar2;
  uint32_t rm_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  code *fn;
  bool is_q_00;
  _Bool local_2b;
  int rot;
  _Bool feature;
  _Bool is_q;
  _Bool u;
  int size;
  int rm;
  int opcode;
  int rn;
  int rd;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  uVar2 = extract32(insn,0xb,4);
  rm_00 = extract32(insn,0x10,5);
  uVar3 = extract32(insn,0x16,2);
  uVar4 = extract32(insn,0x1d,1);
  uVar5 = extract32(insn,0x1e,1);
  is_q_00 = uVar5 != 0;
  iVar6 = (uint)(uVar4 != 0) * 0x10 + uVar2;
  if (iVar6 != 2) {
    if (iVar6 - 0x10U < 2) {
      if ((uVar3 != 1) && (uVar3 != 2)) {
        unallocated_encoding_aarch64(s);
        return;
      }
      local_2b = isar_feature_aa64_rdm(s->isar);
      goto LAB_0082ff00;
    }
    if (iVar6 != 0x12) {
      if ((4 < iVar6 - 0x18U) && (iVar6 != 0x1e)) {
        unallocated_encoding_aarch64(s);
        return;
      }
      if (((uVar3 == 0) || ((uVar3 == 1 && (_Var1 = isar_feature_aa64_fp16(s->isar), !_Var1)))) ||
         ((uVar3 == 3 && (!is_q_00)))) {
        unallocated_encoding_aarch64(s);
        return;
      }
      local_2b = isar_feature_aa64_fcma(s->isar);
      goto LAB_0082ff00;
    }
  }
  if (uVar3 != 2) {
    unallocated_encoding_aarch64(s);
    return;
  }
  local_2b = isar_feature_aa64_dp(s->isar);
LAB_0082ff00:
  if (local_2b == false) {
    unallocated_encoding_aarch64(s);
  }
  else {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      switch(uVar2) {
      case 0:
        if (uVar3 == 1) {
          gen_gvec_op3_env(s,is_q_00,rd_00,rn_00,rm_00,gen_helper_gvec_qrdmlah_s16);
        }
        else {
          if (uVar3 != 2) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2f1d,(char *)0x0);
          }
          gen_gvec_op3_env(s,is_q_00,rd_00,rn_00,rm_00,gen_helper_gvec_qrdmlah_s32);
        }
        break;
      case 1:
        if (uVar3 == 1) {
          gen_gvec_op3_env(s,is_q_00,rd_00,rn_00,rm_00,gen_helper_gvec_qrdmlsh_s16);
        }
        else {
          if (uVar3 != 2) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2f2a,(char *)0x0);
          }
          gen_gvec_op3_env(s,is_q_00,rd_00,rn_00,rm_00,gen_helper_gvec_qrdmlsh_s32);
        }
        break;
      case 2:
        fn = gen_helper_gvec_sdot_b;
        if (uVar4 != 0) {
          fn = gen_helper_gvec_udot_b;
        }
        gen_gvec_op3_ool(s,is_q_00,rd_00,rn_00,rm_00,0,fn);
        break;
      default:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2f60,(char *)0x0);
      case 8:
      case 9:
      case 10:
      case 0xb:
        uVar2 = extract32(uVar2,0,2);
        if (uVar3 == 1) {
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,true,uVar2,gen_helper_gvec_fcmlah);
        }
        else if (uVar3 == 2) {
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,false,uVar2,gen_helper_gvec_fcmlas);
        }
        else {
          if (uVar3 != 3) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2f46,(char *)0x0);
          }
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,false,uVar2,gen_helper_gvec_fcmlad);
        }
        break;
      case 0xc:
      case 0xe:
        uVar2 = extract32(uVar2,1,1);
        if (uVar3 == 1) {
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,true,uVar2,gen_helper_gvec_fcaddh);
        }
        else if (uVar3 == 2) {
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,false,uVar2,gen_helper_gvec_fcadds);
        }
        else {
          if (uVar3 != 3) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2f5b,(char *)0x0);
          }
          gen_gvec_op3_fpst(s,is_q_00,rd_00,rn_00,rm_00,false,uVar2,gen_helper_gvec_fcaddd);
        }
      }
    }
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same_extra(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);
    bool feature;
    int rot;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    case 0x02: /* SDOT (vector) */
    case 0x12: /* UDOT (vector) */
        if (size != MO_32) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_dp, s);
        break;
    case 0x18: /* FCMLA, #0 */
    case 0x19: /* FCMLA, #90 */
    case 0x1a: /* FCMLA, #180 */
    case 0x1b: /* FCMLA, #270 */
    case 0x1c: /* FCADD, #90 */
    case 0x1e: /* FCADD, #270 */
        if (size == 0
            || (size == 1 && !dc_isar_feature(aa64_fp16, s))
            || (size == 3 && !is_q)) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_fcma, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    switch (opcode) {
    case 0x0: /* SQRDMLAH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x1: /* SQRDMLSH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x2: /* SDOT / UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, 0,
                         u ? gen_helper_gvec_udot_b : gen_helper_gvec_sdot_b);
        return;

    case 0x8: /* FCMLA, #0 */
    case 0x9: /* FCMLA, #90 */
    case 0xa: /* FCMLA, #180 */
    case 0xb: /* FCMLA, #270 */
        rot = extract32(opcode, 0, 2);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, true, rot,
                              gen_helper_gvec_fcmlah);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlas);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlad);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0xc: /* FCADD, #90 */
    case 0xe: /* FCADD, #270 */
        rot = extract32(opcode, 1, 1);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddh);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcadds);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddd);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    default:
        g_assert_not_reached();
    }
}